

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

Curl_dns_entry * fetch_addr(connectdata *conn,char *hostname,int port)

{
  int iVar1;
  undefined8 local_58;
  hostcache_prune_data user;
  Curl_easy *data;
  size_t entry_len;
  Curl_dns_entry *dns;
  char *entry_id;
  int port_local;
  char *hostname_local;
  connectdata *conn_local;
  
  user.now = (time_t)conn->data;
  dns = (Curl_dns_entry *)create_hostcache_id(hostname,port);
  if (dns == (Curl_dns_entry *)0x0) {
    conn_local = (connectdata *)0x0;
  }
  else {
    data = (Curl_easy *)strlen((char *)dns);
    entry_len = (size_t)Curl_hash_pick(*(curl_hash **)(user.now + 200),dns,
                                       (size_t)((long)&data->next + 1));
    if (((void *)entry_len == (void *)0x0) && ((*(byte *)(user.now + 0xfe8) & 1) != 0)) {
      (*Curl_cfree)(dns);
      dns = (Curl_dns_entry *)create_hostcache_id("*",port);
      if (dns == (Curl_dns_entry *)0x0) {
        return (Curl_dns_entry *)0x0;
      }
      data = (Curl_easy *)strlen((char *)dns);
      entry_len = (size_t)Curl_hash_pick(*(curl_hash **)(user.now + 200),dns,
                                         (size_t)((long)&data->next + 1));
    }
    if ((entry_len != 0) && (*(long *)(user.now + 0xbf8) != -1)) {
      time(&user.cache_timeout);
      local_58 = *(undefined8 *)(user.now + 0xbf8);
      iVar1 = hostcache_timestamp_remove(&local_58,(void *)entry_len);
      if (iVar1 != 0) {
        Curl_infof((Curl_easy *)user.now,"Hostname in DNS cache was stale, zapped\n");
        entry_len = 0;
        Curl_hash_delete(*(curl_hash **)(user.now + 200),dns,(size_t)((long)&data->next + 1));
      }
    }
    (*Curl_cfree)(dns);
    conn_local = (connectdata *)entry_len;
  }
  return (Curl_dns_entry *)conn_local;
}

Assistant:

static struct Curl_dns_entry *
fetch_addr(struct connectdata *conn,
                const char *hostname,
                int port)
{
  char *entry_id = NULL;
  struct Curl_dns_entry *dns = NULL;
  size_t entry_len;
  struct Curl_easy *data = conn->data;

  /* Create an entry id, based upon the hostname and port */
  entry_id = create_hostcache_id(hostname, port);
  /* If we can't create the entry id, fail */
  if(!entry_id)
    return dns;

  entry_len = strlen(entry_id);

  /* See if its already in our dns cache */
  dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len + 1);

  /* No entry found in cache, check if we might have a wildcard entry */
  if(!dns && data->change.wildcard_resolve) {
    /*
     * Free the previous entry_id before requesting a new one to avoid leaking
     * memory
     */
    free(entry_id);

    entry_id = create_hostcache_id("*", port);

    /* If we can't create the entry id, fail */
    if(!entry_id)
      return dns;

    entry_len = strlen(entry_id);

    /* See if it's already in our dns cache */
    dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len + 1);
  }

  if(dns && (data->set.dns_cache_timeout != -1)) {
    /* See whether the returned entry is stale. Done before we release lock */
    struct hostcache_prune_data user;

    time(&user.now);
    user.cache_timeout = data->set.dns_cache_timeout;

    if(hostcache_timestamp_remove(&user, dns)) {
      infof(data, "Hostname in DNS cache was stale, zapped\n");
      dns = NULL; /* the memory deallocation is being handled by the hash */
      Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);
    }
  }

  /* free the allocated entry_id again */
  free(entry_id);

  return dns;
}